

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtestcase.cpp
# Opt level: O0

char * QTest::toString(QObject *o)

{
  bool bVar1;
  undefined8 uVar2;
  QString *this;
  char *pcVar3;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  char *msg;
  char *className;
  QString *name;
  char *local_40;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RDI == (undefined8 *)0x0) {
    local_40 = (char *)qstrdup("<null>");
  }
  else {
    QObject::objectName();
    (**(code **)*in_RDI)();
    uVar2 = QMetaObject::className();
    local_40 = (char *)operator_new__(0x100);
    bVar1 = QString::isEmpty((QString *)0x157c13);
    if (bVar1) {
      snprintf(local_40,0x100,"%s/%p",uVar2,in_RDI);
    }
    else {
      this = QtPrivate::asString(&local_20);
      QString::toLocal8Bit(this);
      pcVar3 = QByteArray::constData((QByteArray *)0x157caa);
      snprintf(local_40,0x100,"%s/\"%s\"",uVar2,pcVar3);
      QByteArray::~QByteArray((QByteArray *)0x157cd7);
    }
    QString::~QString((QString *)0x157cee);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_40;
  }
  __stack_chk_fail();
}

Assistant:

char *QTest::toString(const QObject *o)
{
    if (o == nullptr)
        return qstrdup("<null>");

    const QString &name = o->objectName();
    const char *className = o->metaObject()->className();
    char *msg = new char[256];
    if (name.isEmpty())
        std::snprintf(msg, 256, "%s/%p", className, o);
    else
        std::snprintf(msg, 256, "%s/\"%s\"", className, qPrintable(name));
    return msg;
}